

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RuntimeFunction * __thiscall
Js::JavascriptLibrary::CreateBuiltinConstructor
          (JavascriptLibrary *this,FunctionInfo *functionInfo,DynamicTypeHandler *typeHandler,
          DynamicObject *prototype)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  ConstructorCache *prototype_00;
  bool bVar2;
  Attributes AVar3;
  undefined4 *puVar4;
  DynamicObject **ppDVar5;
  ConstructorCache **ppCVar6;
  ScriptContext **ppSVar7;
  JavascriptMethod entryPoint;
  Recycler *pRVar8;
  RuntimeFunction *this_00;
  DynamicType *local_78;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_61;
  TrackAllocData local_60;
  DynamicType *local_38;
  DynamicType *type;
  ConstructorCache *ctorCache;
  DynamicObject *prototype_local;
  DynamicTypeHandler *typeHandler_local;
  FunctionInfo *functionInfo_local;
  JavascriptLibrary *this_local;
  
  ctorCache = (ConstructorCache *)prototype;
  prototype_local = (DynamicObject *)typeHandler;
  typeHandler_local = (DynamicTypeHandler *)functionInfo;
  functionInfo_local = (FunctionInfo *)this;
  AVar3 = FunctionInfo::GetAttributes(functionInfo);
  if ((AVar3 & ErrorOnNew) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x12bb,
                                "((functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                ,
                                "(functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (ctorCache == (ConstructorCache *)0x0) {
    ppDVar5 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
    ctorCache = (ConstructorCache *)*ppDVar5;
  }
  AVar3 = FunctionInfo::GetAttributes((FunctionInfo *)typeHandler_local);
  if ((AVar3 & SkipDefaultNewObject) == None) {
    local_78 = (DynamicType *)ConstructorCache::DefaultInstance;
  }
  else {
    ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_ConstructorCache__
                        ((WriteBarrierPtr *)&this->builtInConstructorCache);
    local_78 = (DynamicType *)*ppCVar6;
  }
  type = local_78;
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  prototype_00 = ctorCache;
  scriptContext = *ppSVar7;
  entryPoint = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)typeHandler_local);
  local_38 = DynamicType::New(scriptContext,TypeIds_Function,(RecyclableObject *)prototype_00,
                              entryPoint,(DynamicTypeHandler *)prototype_local,false,false);
  pRVar8 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&RuntimeFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x12c7);
  pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_60);
  this_00 = (RuntimeFunction *)new<(Memory::ObjectInfoBits)1>(0x40,pRVar8,&local_61);
  RuntimeFunction::RuntimeFunction
            (this_00,local_38,(FunctionInfo *)typeHandler_local,(ConstructorCache *)type);
  return this_00;
}

Assistant:

RuntimeFunction* JavascriptLibrary::CreateBuiltinConstructor(FunctionInfo * functionInfo, DynamicTypeHandler * typeHandler, DynamicObject* prototype)
    {
        Assert((functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0);

        if (prototype == nullptr)
        {
            prototype = functionPrototype;
        }

        ConstructorCache* ctorCache = ((functionInfo->GetAttributes() & FunctionInfo::Attributes::SkipDefaultNewObject) != 0) ?
            static_cast<ConstructorCache*>(this->builtInConstructorCache) : &ConstructorCache::DefaultInstance;

        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, prototype, functionInfo->GetOriginalEntryPoint(), typeHandler);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, RuntimeFunction, type, functionInfo, ctorCache);
    }